

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O3

int sp_coletree(int_t *acolst,int_t *acolend,int_t *arow,int nr,int nc,int *parent)

{
  undefined1 auVar1 [16];
  int *addr;
  int *addr_00;
  int *addr_01;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  
  addr = mxCallocInt(nc);
  addr_00 = mxCallocInt(nc);
  addr_01 = mxCallocInt(nr);
  auVar1 = _DAT_001143b0;
  if (0 < nr) {
    lVar2 = (ulong)(uint)nr - 1;
    auVar11._8_4_ = (int)lVar2;
    auVar11._0_8_ = lVar2;
    auVar11._12_4_ = (int)((ulong)lVar2 >> 0x20);
    lVar2 = 0;
    auVar11 = auVar11 ^ _DAT_001143b0;
    auVar12 = _DAT_00114390;
    auVar13 = _DAT_001143a0;
    do {
      auVar14 = auVar13 ^ auVar1;
      iVar3 = auVar11._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar3 && auVar11._0_4_ < auVar14._0_4_ || iVar3 < auVar14._4_4_)
                & 1)) {
        *(int *)((long)addr_01 + lVar2) = nc;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        *(int *)((long)addr_01 + lVar2 + 4) = nc;
      }
      auVar14 = auVar12 ^ auVar1;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar3 && (iVar15 != iVar3 || auVar14._0_4_ <= auVar11._0_4_)) {
        *(int *)((long)addr_01 + lVar2 + 8) = nc;
        *(int *)((long)addr_01 + lVar2 + 0xc) = nc;
      }
      lVar10 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar10 + 4;
      lVar10 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar10 + 4;
      lVar2 = lVar2 + 0x10;
    } while ((ulong)(nr + 3U >> 2) << 4 != lVar2);
  }
  if (0 < nc) {
    uVar4 = 0;
    do {
      lVar2 = (long)acolst[uVar4];
      if (acolst[uVar4] < acolend[uVar4]) {
        do {
          iVar3 = addr_01[arow[lVar2]];
          if ((int)uVar4 <= addr_01[arow[lVar2]]) {
            iVar3 = (int)uVar4;
          }
          addr_01[arow[lVar2]] = iVar3;
          lVar2 = lVar2 + 1;
        } while (lVar2 < acolend[uVar4]);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)nc);
    if (0 < nc) {
      uVar4 = 0;
      do {
        iVar3 = (int)uVar4;
        addr_00[uVar4] = iVar3;
        addr[uVar4] = iVar3;
        parent[uVar4] = nc;
        lVar2 = (long)acolst[uVar4];
        if (acolst[uVar4] < acolend[uVar4]) {
          uVar5 = uVar4 & 0xffffffff;
          do {
            lVar10 = (long)addr_01[arow[lVar2]];
            uVar7 = (uint)uVar5;
            if (lVar10 < (long)uVar4) {
              uVar6 = addr_00[lVar10];
              lVar8 = (long)(int)uVar6;
              uVar9 = addr_00[lVar8];
              if (uVar9 != uVar6) {
                do {
                  addr_00[lVar10] = uVar9;
                  lVar10 = (long)(int)uVar9;
                  uVar6 = addr_00[lVar10];
                  lVar8 = (long)(int)uVar6;
                  uVar9 = addr_00[lVar8];
                } while (uVar9 != uVar6);
              }
              if (uVar4 != (uint)addr[lVar8]) {
                parent[addr[lVar8]] = iVar3;
                addr_00[(int)uVar7] = uVar6;
                addr[lVar8] = iVar3;
                uVar7 = uVar6;
              }
            }
            lVar2 = lVar2 + 1;
            uVar5 = (ulong)uVar7;
          } while (lVar2 < acolend[uVar4]);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != (uint)nc);
    }
  }
  superlu_free(addr);
  superlu_free(addr_01);
  superlu_free(addr_00);
  return 0;
}

Assistant:

int sp_coletree(
                const int_t *acolst, const int_t *acolend, /* column start and end past 1 */
                const int_t *arow,                 /* row indices of A */
                int nr, int nc,            /* dimension of A */
                int *parent)               /* parent in elim tree */
{
	int	*root;			/* root of subtree of etree 	*/
	int     *firstcol;		/* first nonzero col in each row*/
	int	rset, cset;             
	int	row, col;
	int	rroot;
	int	p;
	int     *pp;

	root = mxCallocInt (nc);
	initialize_disjoint_sets (nc, &pp);

	/* Compute firstcol[row] = first nonzero column in row */

	firstcol = mxCallocInt (nr);
	for (row = 0; row < nr; firstcol[row++] = nc);
	for (col = 0; col < nc; col++) 
		for (p = acolst[col]; p < acolend[col]; p++) {
			row = arow[p];
			firstcol[row] = SUPERLU_MIN(firstcol[row], col);
		}

	/* Compute etree by Liu's algorithm for symmetric matrices,
           except use (firstcol[r],c) in place of an edge (r,c) of A.
	   Thus each row clique in A'*A is replaced by a star
	   centered at its first vertex, which has the same fill. */

	for (col = 0; col < nc; col++) {
		cset = make_set (col, pp);
		root[cset] = col;
		parent[col] = nc; /* Matlab */
		for (p = acolst[col]; p < acolend[col]; p++) {
			row = firstcol[arow[p]];
			if (row >= col) continue;
			rset = find (row, pp);
			rroot = root[rset];
			if (rroot != col) {
				parent[rroot] = col;
				cset = link (cset, rset, pp);
				root[cset] = col;
			}
		}
	}

	SUPERLU_FREE (root);
	SUPERLU_FREE (firstcol);
	finalize_disjoint_sets (pp);
	return 0;
}